

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::kotlin::MessageGenerator::MessageGenerator
          (MessageGenerator *this,Descriptor *descriptor,Context *context)

{
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *this_00;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this_01;
  pointer ppIVar1;
  pointer ppIVar2;
  pointer ppIVar3;
  pointer ppIVar4;
  bool bVar5;
  bool bVar6;
  ClassNameResolver *pCVar7;
  reference ppVar8;
  string *psVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  Descriptor *descriptor_00;
  OneofDescriptor *pOVar13;
  node_handle<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>,_absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_void>
  node;
  undefined1 local_88 [16];
  OneofDescriptor *local_78;
  pointer ppIStack_70;
  btree<absl::lts_20240722::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
  *local_68;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *local_60;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *local_58;
  map_slot_type<int,_const_google::protobuf::OneofDescriptor_*> *local_50;
  pair<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>,_bool>
  local_48;
  
  this->_vptr_MessageGenerator = (_func_int **)&PTR__MessageGenerator_00512be0;
  this->context_ = context;
  pCVar7 = java::Context::GetNameResolver(context);
  this->name_resolver_ = pCVar7;
  this->descriptor_ = descriptor;
  (this->oneofs_).
  super_btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
                 ::EmptyNode()::empty_node;
  (this->oneofs_).
  super_btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_*,_2UL,_false>
  .value = (btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
            *)absl::lts_20240722::container_internal::
              btree<absl::lts_20240722::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
              ::EmptyNode()::empty_node;
  (this->oneofs_).
  super_btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .tree_.size_ = 0;
  bVar6 = (context->options_).enforce_lite;
  this->lite_ = bVar6;
  bVar5 = true;
  if (bVar6 == true) {
    bVar5 = (context->options_).jvm_dsl;
  }
  local_68 = (btree<absl::lts_20240722::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
              *)&this->oneofs_;
  this->jvm_dsl_ = bVar5;
  this_00 = &this->lite_field_generators_;
  java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
  FieldGeneratorMap(this_00,descriptor);
  this_01 = &this->field_generators_;
  java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
  FieldGeneratorMap(this_01,this->descriptor_);
  descriptor_00 = this->descriptor_;
  local_60 = this_01;
  local_58 = this_00;
  if (0 < *(int *)(descriptor_00 + 4)) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      bVar6 = java::IsRealOneof((FieldDescriptor *)(*(long *)(descriptor_00 + 0x38) + lVar10));
      if (bVar6) {
        lVar12 = (long)*(int *)(this->descriptor_ + 4);
        if (lVar12 <= lVar11) {
          psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             (lVar11,lVar12,"index < field_count()");
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_88,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0x9f4,*(undefined8 *)(psVar9 + 8),*(undefined8 *)psVar9);
LAB_002b68fc:
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)local_88);
        }
        lVar12 = *(long *)(this->descriptor_ + 0x38);
        if ((*(byte *)(lVar12 + 1 + lVar10) & 0x10) == 0) {
          pOVar13 = (OneofDescriptor *)0x0;
        }
        else {
          pOVar13 = *(OneofDescriptor **)(lVar12 + 0x28 + lVar10);
          if (pOVar13 == (OneofDescriptor *)0x0) {
            google::protobuf::internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xa9a);
          }
        }
        local_88[1] = 1;
        local_88._12_4_ = 0;
        local_88._8_4_ =
             (int)((ulong)((long)pOVar13 - *(long *)(*(long *)(pOVar13 + 0x10) + 0x40)) >> 3) *
             -0x49249249;
        local_78 = pOVar13;
        local_50 = (map_slot_type<int,_const_google::protobuf::OneofDescriptor_*> *)(local_88 + 8);
        absl::lts_20240722::container_internal::
        btree<absl::lts_20240722::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
        ::
        insert_unique<int,absl::lts_20240722::container_internal::map_slot_type<int,google::protobuf::OneofDescriptor_const*>*&>
                  (&local_48,local_68,
                   &((map_slot_type<int,_const_google::protobuf::OneofDescriptor_*> *)(local_88 + 8)
                    )->key,&local_50);
        ppVar8 = absl::lts_20240722::container_internal::
                 btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                 ::operator*(&local_48.first);
        if (ppVar8->second != pOVar13) {
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_88,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/kotlin/message.cc"
                     ,0x32,0x3d,"oneofs_.emplace(oneof->index(), oneof).first->second == oneof");
          goto LAB_002b68fc;
        }
      }
      lVar11 = lVar11 + 1;
      descriptor_00 = this->descriptor_;
      lVar10 = lVar10 + 0x58;
    } while (lVar11 < *(int *)(descriptor_00 + 4));
  }
  if (this->lite_ == false) {
    java::MakeImmutableFieldGenerators
              ((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *)
               local_88,descriptor_00,this->context_);
    ppIVar3 = (this->field_generators_).field_generators_.
              super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppIVar4 = (this->field_generators_).field_generators_.
              super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->field_generators_).descriptor_ =
         (Descriptor *)CONCAT62(local_88._2_6_,CONCAT11(local_88[1],local_88[0]));
    (this->field_generators_).field_generators_.
    super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._8_8_;
    (this->field_generators_).field_generators_.
    super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_78;
    (this->field_generators_).field_generators_.
    super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppIStack_70;
    local_88._8_8_ = (pointer)0x0;
    local_78 = (OneofDescriptor *)0x0;
    ppIStack_70 = (pointer)0x0;
    if (ppIVar3 != (pointer)0x0) {
      operator_delete(ppIVar3,(long)ppIVar4 - (long)ppIVar3);
    }
    java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
    ~FieldGeneratorMap((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>
                        *)local_88);
  }
  else {
    java::MakeImmutableFieldLiteGenerators
              ((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *)
               local_88,descriptor_00,this->context_);
    ppIVar1 = (this->lite_field_generators_).field_generators_.
              super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppIVar2 = (this->lite_field_generators_).field_generators_.
              super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->lite_field_generators_).descriptor_ =
         (Descriptor *)CONCAT62(local_88._2_6_,CONCAT11(local_88[1],local_88[0]));
    (this->lite_field_generators_).field_generators_.
    super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._8_8_;
    (this->lite_field_generators_).field_generators_.
    super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_78;
    (this->lite_field_generators_).field_generators_.
    super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppIStack_70;
    local_88._8_8_ = (pointer)0x0;
    local_78 = (OneofDescriptor *)0x0;
    ppIStack_70 = (pointer)0x0;
    if (ppIVar1 != (pointer)0x0) {
      operator_delete(ppIVar1,(long)ppIVar2 - (long)ppIVar1);
    }
    java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
    ~FieldGeneratorMap((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>
                        *)local_88);
  }
  return;
}

Assistant:

MessageGenerator::MessageGenerator(const Descriptor* descriptor,
                                   java::Context* context)
    : context_(context),
      name_resolver_(context->GetNameResolver()),
      descriptor_(descriptor),
      lite_(!java::HasDescriptorMethods(descriptor_->file(),
                                        context->EnforceLite())),
      jvm_dsl_(!lite_ || context->options().jvm_dsl),
      lite_field_generators_(
          java::FieldGeneratorMap<java::ImmutableFieldLiteGenerator>(
              descriptor_)),
      field_generators_(
          java::FieldGeneratorMap<java::ImmutableFieldGenerator>(descriptor_)) {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (java::IsRealOneof(descriptor_->field(i))) {
      const OneofDescriptor* oneof = descriptor_->field(i)->containing_oneof();
      ABSL_CHECK(oneofs_.emplace(oneof->index(), oneof).first->second == oneof);
    }
  }
  if (lite_) {
    lite_field_generators_ =
        java::MakeImmutableFieldLiteGenerators(descriptor_, context_);
  } else {
    field_generators_ =
        java::MakeImmutableFieldGenerators(descriptor_, context_);
  }
}